

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseColGroup(TidyDocImpl *doc,Node *colgroup,GetTokenMode mode)

{
  Dict *pDVar1;
  Bool BVar2;
  Node *node;
  Node *pNVar3;
  TidyParserMemory memory;
  Node *pNStack_48;
  GetTokenMode GStack_30;
  
  if (colgroup == (Node *)0x0) {
    prvTidypopMemory(doc);
    colgroup = pNStack_48;
    mode = GStack_30;
  }
  else if ((colgroup->tag->model & 1) != 0) {
    return (Node *)0x0;
  }
  while( true ) {
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    pDVar1 = node->tag;
    if (pDVar1 != colgroup->tag) break;
    if (node->type == EndTag) {
      prvTidyFreeNode(doc,node);
      colgroup->closed = yes;
      return (Node *)0x0;
    }
LAB_00138c4d:
    BVar2 = prvTidynodeIsText(node);
    if (BVar2 != no) goto LAB_00138ca2;
    BVar2 = InsertMisc(colgroup,node);
    if (BVar2 == no) {
      if (node->tag != (Dict *)0x0) {
        if (node->tag->id != TidyTag_COL) {
LAB_00138ca2:
          prvTidyUngetToken(doc);
          return (Node *)0x0;
        }
        if (node->type != EndTag) {
          prvTidyInsertNodeAtEnd(colgroup,node);
          prvTidypushMemory(doc,(TidyParserMemory)
                                ZEXT3648(CONCAT432(mode,CONCAT824(0,CONCAT816(node,CONCAT88(colgroup
                                                  ,prvTidyParseColGroup))))));
          return node;
        }
      }
LAB_00138c7d:
      prvTidyReport(doc,colgroup,node,0x235);
      prvTidyFreeNode(doc,node);
    }
  }
  if (node->type != EndTag) goto LAB_00138c4d;
  pNVar3 = colgroup;
  if ((pDVar1 == (Dict *)0x0) || (pDVar1->id != TidyTag_FORM)) {
    while (pNVar3 = pNVar3->parent, pNVar3 != (Node *)0x0) {
      if (pDVar1 == pNVar3->tag) goto LAB_00138ca2;
    }
    goto LAB_00138c4d;
  }
  *(byte *)&doc->badForm = (byte)doc->badForm | 1;
  goto LAB_00138c7d;
}

Assistant:

Node* TY_(ParseColGroup)( TidyDocImpl* doc, Node *colgroup, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node, *parent;
    DEBUG_LOG_COUNTERS;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( colgroup == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        colgroup = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(colgroup);
        if (colgroup->tag->model & CM_EMPTY)
            return NULL;
    }

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);

        if (node->tag == colgroup->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            colgroup->closed = yes;
            return NULL;
        }

        /*
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = colgroup->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        if (TY_(nodeIsText)(node))
        {
            TY_(UngetToken)( doc );
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(colgroup, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsCOL(node) )
        {
            TY_(UngetToken)( doc );
            DEBUG_LOG_EXIT;
            return NULL;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* node should be <COL> */
        TY_(InsertNodeAtEnd)(colgroup, node);
        
        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseColGroup);
            memory.original_node = colgroup;
            memory.reentry_node = node;
            memory.mode = mode;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
        }
        DEBUG_LOG_EXIT;
        return node;
    }
    DEBUG_LOG_EXIT;
    return NULL;
}